

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::LoadNextRandomPermutation(Alice *this)

{
  pointer piVar1;
  int i;
  int iVar2;
  int j;
  long temp;
  
  if (LoadNextRandomPermutation()::pin == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextRandomPermutation()::pin);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (LoadNextRandomPermutation()::pin,"../randoms/alice/Permutations_PA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextRandomPermutation()::pin,&__dso_handle);
      __cxa_guard_release(&LoadNextRandomPermutation()::pin);
    }
  }
  if (LoadNextRandomPermutation()::din == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextRandomPermutation()::din);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (LoadNextRandomPermutation()::din,"../randoms/alice/Permutations_DA.txt",_S_in);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextRandomPermutation()::din,&__dso_handle);
      __cxa_guard_release(&LoadNextRandomPermutation()::din);
    }
  }
  piVar1 = (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->super_Party).Pi_P.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  piVar1 = (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  for (iVar2 = 0; iVar2 < (this->super_Party).n_p; iVar2 = iVar2 + 1) {
    std::istream::_M_extract<long>((long *)LoadNextRandomPermutation()::pin);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&(this->super_Party).Pi_P,(int *)((long)&temp + 4));
  }
  for (iVar2 = 0; iVar2 < (this->super_Party).n_d; iVar2 = iVar2 + 1) {
    std::istream::_M_extract<long>((long *)LoadNextRandomPermutation()::din);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&(this->super_Party).Pi_D,(int *)((long)&temp + 4));
  }
  return;
}

Assistant:

void Alice::LoadNextRandomPermutation()
{
    static std::ifstream pin("../randoms/alice/Permutations_PA.txt");
    static std::ifstream din("../randoms/alice/Permutations_DA.txt");
    long temp;
    Pi_P.clear();
    Pi_D.clear();
    for(int i=0; i < n_p; i++)
    {
        pin>>temp;
        Pi_P.push_back(temp);
    }
    for(int j=0; j < n_d; j++)
    {
        din>>temp;
        Pi_D.push_back(temp);
    }   
}